

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::insert_example
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,bool fake_insert)

{
  uint64_t *puVar1;
  node *pnVar2;
  example *peVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  bool bVar6;
  wclass *pwVar7;
  size_t sVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  size_t sVar12;
  wclass *pwVar13;
  ulong uVar14;
  int iVar15;
  uint32_t cn;
  ulong uVar16;
  float fVar17;
  labels preds;
  v_array<unsigned_int> leaf_labs;
  v_array<unsigned_int> local_58;
  
  if (((b->nodes)._begin)->internal == 1) {
    uVar16 = 0;
    do {
      fVar17 = train_node(b,base,(b->examples)._begin[*ec_array_index],(uint32_t)uVar16);
      pnVar2 = (b->nodes)._begin;
      bVar6 = 0.0 <= fVar17;
      (&pnVar2[uVar16].nl)[bVar6] = (&pnVar2[uVar16].nl)[bVar6] + 1.0;
      uVar16 = (ulong)(&pnVar2[uVar16].left)[bVar6];
    } while ((b->nodes)._begin[uVar16].internal == 1);
  }
  else {
    uVar16 = 0;
  }
  cn = (uint32_t)uVar16;
  if (b->oas == 1) {
    peVar3 = (b->examples)._begin[*ec_array_index];
    local_58.end_array = (uint *)0x0;
    local_58.erase_count = 0;
    local_58._begin = (uint *)0x0;
    local_58._end = (uint *)0x0;
    collect_labels_from_leaf(b,cn,&local_58);
    pwVar4 = (wclass *)(peVar3->l).multilabels.label_v._begin;
    pwVar5 = (peVar3->l).cs.costs._end;
    pwVar7 = (peVar3->l).cs.costs.end_array;
    sVar8 = (peVar3->l).cs.costs.erase_count;
    pfVar9 = (peVar3->pred).scalars._begin;
    pfVar10 = (peVar3->pred).scalars._end;
    pfVar11 = (peVar3->pred).scalars.end_array;
    sVar12 = (peVar3->pred).scalars.erase_count;
    (peVar3->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
    (peVar3->l).simple.initial = 0.0;
    if (local_58._end != local_58._begin) {
      uVar14 = 0;
      do {
        (peVar3->l).multi.label = 0xbf800000;
        bVar6 = pwVar4 != pwVar5;
        if (pwVar4 == pwVar5) {
LAB_001d75c8:
          if (bVar6) goto LAB_001d75cd;
        }
        else {
          fVar17 = pwVar4->x;
          pwVar13 = pwVar4;
          while (fVar17 != (float)local_58._begin[uVar14]) {
            pwVar13 = (wclass *)&pwVar13->class_index;
            bVar6 = pwVar13 != pwVar5;
            if (pwVar13 == pwVar5) goto LAB_001d75c8;
            fVar17 = *(float *)pwVar13;
          }
LAB_001d75cd:
          (peVar3->l).multi.label = 0x3f800000;
        }
        iVar15 = (int)b->max_routers + local_58._begin[uVar14] + 1;
        puVar1 = &(peVar3->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar15);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar3)
        ;
        puVar1 = &(peVar3->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar15 * *(int *)(base + 0xe0));
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)local_58._end - (long)local_58._begin >> 2));
    }
    (peVar3->pred).scalars.end_array = pfVar11;
    (peVar3->pred).scalars.erase_count = sVar12;
    (peVar3->pred).scalars._begin = pfVar9;
    (peVar3->pred).scalars._end = pfVar10;
    (peVar3->l).multilabels.label_v._begin = (uint *)pwVar4;
    (peVar3->l).cs.costs._end = pwVar5;
    (peVar3->l).cs.costs.end_array = pwVar7;
    (peVar3->l).cs.costs.erase_count = sVar8;
  }
  pnVar2 = (b->nodes)._begin;
  if (pnVar2[uVar16].internal == -1 && !fake_insert) {
    v_array<unsigned_int>::push_back(&pnVar2[uVar16].examples_index,ec_array_index);
    pnVar2 = (b->nodes)._begin;
    uVar14 = (long)pnVar2[uVar16].examples_index._end - (long)pnVar2[uVar16].examples_index._begin
             >> 2;
    if (b->max_ex_in_leaf < uVar14) {
      b->max_ex_in_leaf = uVar14;
    }
    fVar17 = train_node(b,base,(b->examples)._begin[*ec_array_index],cn);
    pnVar2 = (b->nodes)._begin;
    (&pnVar2[uVar16].nl)[0.0 <= fVar17] = (&pnVar2[uVar16].nl)[0.0 <= fVar17] + 1.0;
    pnVar2 = (b->nodes)._begin;
    if ((b->max_leaf_examples <=
         (ulong)((long)pnVar2[uVar16].examples_index._end -
                 (long)pnVar2[uVar16].examples_index._begin >> 2)) &&
       (((long)(b->nodes)._end - (long)pnVar2 >> 3) * -0x71c71c71c71c71c7 + 2U <= b->max_nodes)) {
      split_leaf(b,base,cn);
    }
  }
  return;
}

Assistant:

void insert_example(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, bool fake_insert = false)
    {
        uint32_t cn = 0; //start from the root.
        while(b.nodes[cn].internal == 1) //if it's internal node:
        {   
            //predict and train the node at cn.
            float router_pred = train_node(b, base, *b.examples[ec_array_index], cn); 
            uint32_t newcn = insert_descent(b.nodes[cn], router_pred); //updated nr or nl
            cn = newcn; 
        }
    
        if (b.oas == true)  //if useing oas as inference procedure, we just train oas here, as it's independent of the memory unit anyway'
            train_one_against_some_at_leaf(b, base, cn, *b.examples[ec_array_index]);

        if((b.nodes[cn].internal == -1) && (fake_insert == false)) //get to leaf:
        {   
            b.nodes[cn].examples_index.push_back(ec_array_index);
            if (b.nodes[cn].examples_index.size() > b.max_ex_in_leaf)
            {
                b.max_ex_in_leaf = b.nodes[cn].examples_index.size();
            }
            float leaf_pred = train_node(b, base, *b.examples[ec_array_index], cn); //tain the leaf as well.
            insert_descent(b.nodes[cn], leaf_pred); //this is a faked descent, the purpose is only to update nl and nr of cn

            //if the number of examples exceeds the max_leaf_examples, and not reach the max_nodes - 2 yet, we split:
            if((b.nodes[cn].examples_index.size() >= b.max_leaf_examples) && (b.nodes.size() + 2 <= b.max_nodes)){
                split_leaf(b, base, cn); 
            }
        }
    }